

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

string * __thiscall
CBlockIndex::ToString_abi_cxx11_(string *__return_storage_ptr__,CBlockIndex *this)

{
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  string local_58;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256u>::ToString_abi_cxx11_(&local_38,&this->hashMerkleRoot);
  if (this->phashBlock == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  args_3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (this->phashBlock->super_base_blob<256U>).m_data._M_elems;
  base_blob<256u>::ToString_abi_cxx11_(&local_58,&stack0xffffffffffffff88);
  tinyformat::format<CBlockIndex*,int,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,
             (tinyformat *)"CBlockIndex(pprev=%p, nHeight=%d, merkle=%s, hashBlock=%s)",
             (char *)&this->pprev,(CBlockIndex **)&this->nHeight,(int *)&local_38,&local_58,args_3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CBlockIndex::ToString() const
{
    return strprintf("CBlockIndex(pprev=%p, nHeight=%d, merkle=%s, hashBlock=%s)",
                     pprev, nHeight, hashMerkleRoot.ToString(), GetBlockHash().ToString());
}